

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O2

void __thiscall QFileSystemMetaData::fillFromStatxBuf(QFileSystemMetaData *this,statx *statxBuffer)

{
  __u32 _Var1;
  MetaDataFlags MVar2;
  long lVar3;
  uint uVar4;
  
  MVar2 = flagsFromStMode((uint)statxBuffer->stx_mode,(quint64)statxBuffer);
  uVar4 = (this->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
          super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i |
          (uint)MVar2.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i;
  (this->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
  super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i = uVar4;
  (this->knownFlagsMask).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
  super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
       (uint)MVar2.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
             super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i |
       (this->knownFlagsMask).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
       super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i | 0x72a67077;
  if (statxBuffer->stx_nlink == 0) {
    (this->entryFlags).super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
    super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i = uVar4 | 0x40000000;
  }
  this->size_ = statxBuffer->stx_size;
  this->accessTime_ =
       (long)((statxBuffer->stx_atime).tv_sec * 1000000000 + (ulong)(statxBuffer->stx_atime).tv_nsec
             ) / 1000000;
  this->metadataChangeTime_ =
       (long)((statxBuffer->stx_ctime).tv_sec * 1000000000 + (ulong)(statxBuffer->stx_ctime).tv_nsec
             ) / 1000000;
  this->modificationTime_ =
       (long)((statxBuffer->stx_mtime).tv_sec * 1000000000 + (ulong)(statxBuffer->stx_mtime).tv_nsec
             ) / 1000000;
  if ((statxBuffer->stx_mask & 0x800) == 0) {
    lVar3 = 0;
  }
  else {
    lVar3 = (long)((statxBuffer->stx_btime).tv_sec * 1000000000 +
                  (ulong)(statxBuffer->stx_btime).tv_nsec) / 1000000;
  }
  this->birthTime_ = lVar3;
  _Var1 = statxBuffer->stx_gid;
  this->userId_ = statxBuffer->stx_uid;
  this->groupId_ = _Var1;
  return;
}

Assistant:

inline void QFileSystemMetaData::fillFromStatxBuf(const struct statx &statxBuffer)
{
    // Permissions
    MetaDataFlags flags = flagsFromStMode(statxBuffer.stx_mode, statxBuffer.stx_attributes);
    entryFlags |= flags;
    knownFlagsMask |= flags | PosixStatFlags;

    // Attributes
    if (statxBuffer.stx_nlink == 0)
        entryFlags |= QFileSystemMetaData::WasDeletedAttribute;
    size_ = qint64(statxBuffer.stx_size);

    // Times
    using namespace GetFileTimes;
    accessTime_ = timespecToMSecs(statxBuffer.stx_atime);
    metadataChangeTime_ = timespecToMSecs(statxBuffer.stx_ctime);
    modificationTime_ = timespecToMSecs(statxBuffer.stx_mtime);
    const bool birthMask = statxBuffer.stx_mask & STATX_BTIME;
    birthTime_ = birthMask ? timespecToMSecs(statxBuffer.stx_btime) : 0;

    userId_ = statxBuffer.stx_uid;
    groupId_ = statxBuffer.stx_gid;
}